

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O1

void test_cpp_wrapper_all_records
               (planck_unit_test_t *tc,Dictionary<int,_int> *dict,int random_positive_num)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uStack_40;
  int aiStack_38 [2];
  
  lVar1 = -((ulong)(uint)random_positive_num * 4 + 0xf & 0xfffffffffffffff0);
  aiStack_38[1] = random_positive_num;
  if (0 < random_positive_num) {
    uVar3 = 0;
    do {
      iVar2 = (int)uVar3;
      *(undefined8 *)((long)&uStack_40 + lVar1) = 0x109b4a;
      cpp_wrapper_insert(tc,dict,iVar2,iVar2,'\x01');
      ((int *)((long)aiStack_38 + lVar1))[uVar3] = iVar2;
      uVar3 = uVar3 + 1;
    } while ((uint)random_positive_num != uVar3);
  }
  iVar2 = aiStack_38[1];
  *(undefined8 *)((long)&uStack_40 + lVar1) = 0x109b6d;
  cpp_wrapper_all_records(tc,dict,(int *)((long)aiStack_38 + lVar1),iVar2,'\x01');
  return;
}

Assistant:

void
test_cpp_wrapper_all_records(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int random_positive_num
) {
	int records[random_positive_num];

	for (int i = 0; i < random_positive_num; i++) {
		cpp_wrapper_insert(tc, dict, i, i, boolean_true);
		records[i] = i;
	}

	cpp_wrapper_all_records(tc, dict, records, random_positive_num, boolean_true);
}